

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

Cnf_Dat_t * Mf_ManDeriveCnf(Mf_Man_t *p,int fCnfObjIds,int fAddOrCla)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  Gia_Obj_t *pGVar7;
  void *pvVar8;
  int *pCut_00;
  int *piVar9;
  bool bVar10;
  int fComplLast;
  int *pCubes;
  int nCubes;
  int iFunc;
  int c;
  int k;
  int i;
  int *pCnfIds;
  int *pCut;
  int pFanins [16];
  Vec_Int_t *vCnfIds;
  Vec_Int_t *vCnfs;
  int iLit;
  int iCla;
  int iVar;
  int nLits;
  int nClas;
  int nVars;
  int DriId;
  int Id;
  Gia_Obj_t *pObj;
  Cnf_Dat_t *pCnf;
  int fAddOrCla_local;
  int fCnfObjIds_local;
  Mf_Man_t *p_local;
  
  iLit = 1;
  vCnfs._4_4_ = 0;
  vCnfs._0_4_ = 0;
  pCnf._0_4_ = fAddOrCla;
  pCnf._4_4_ = fCnfObjIds;
  _fAddOrCla_local = p;
  p_00 = Mf_ManDeriveCnfs(p,&nLits,&iVar,&iCla);
  iVar2 = Gia_ManObjNum(_fAddOrCla_local->pGia);
  pFanins._56_8_ = Vec_IntStartFull(iVar2);
  piVar6 = Vec_IntArray((Vec_Int_t *)pFanins._56_8_);
  nLits = nLits + 1;
  if ((int)pCnf != 0) {
    iVar = iVar + 1;
    iVar2 = Gia_ManCoNum(_fAddOrCla_local->pGia);
    iCla = iVar2 + iCla;
  }
  if (pCnf._4_4_ == 0) {
    c = 0;
    while( true ) {
      iVar2 = Vec_IntSize(_fAddOrCla_local->pGia->vCos);
      bVar10 = false;
      if (c < iVar2) {
        pGVar1 = _fAddOrCla_local->pGia;
        pGVar7 = Gia_ManCo(_fAddOrCla_local->pGia,c);
        nVars = Gia_ObjId(pGVar1,pGVar7);
        bVar10 = nVars != 0;
      }
      if (!bVar10) break;
      Vec_IntWriteEntry((Vec_Int_t *)pFanins._56_8_,nVars,iLit);
      c = c + 1;
      iLit = iLit + 1;
    }
    nVars = _fAddOrCla_local->pGia->nObjs;
    while (nVars = nVars + -1, 0 < nVars) {
      pGVar7 = Gia_ManObj(_fAddOrCla_local->pGia,nVars);
      iVar2 = Gia_ObjIsAnd(pGVar7);
      if ((iVar2 != 0) && (iVar2 = Mf_ObjMapRefNum(_fAddOrCla_local,nVars), iVar2 != 0)) {
        Vec_IntWriteEntry((Vec_Int_t *)pFanins._56_8_,nVars,iLit);
        iLit = iLit + 1;
      }
    }
    Vec_IntWriteEntry((Vec_Int_t *)pFanins._56_8_,0,iLit);
    c = 0;
    while( true ) {
      iLit = iLit + 1;
      iVar2 = Vec_IntSize(_fAddOrCla_local->pGia->vCis);
      bVar10 = false;
      if (c < iVar2) {
        pGVar1 = _fAddOrCla_local->pGia;
        pGVar7 = Gia_ManCi(_fAddOrCla_local->pGia,c);
        nVars = Gia_ObjId(pGVar1,pGVar7);
        bVar10 = nVars != 0;
      }
      if (!bVar10) break;
      Vec_IntWriteEntry((Vec_Int_t *)pFanins._56_8_,nVars,iLit);
      c = c + 1;
    }
    if (iLit != nLits) {
      __assert_fail("iVar == nVars",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                    ,0x16c,"Cnf_Dat_t *Mf_ManDeriveCnf(Mf_Man_t *, int, int)");
    }
  }
  else {
    iVar2 = Gia_ManCiNum(_fAddOrCla_local->pGia);
    iVar3 = Gia_ManCoNum(_fAddOrCla_local->pGia);
    iLit = iVar2 + iVar3 + 2;
    c = 0;
    while( true ) {
      iVar2 = Vec_IntSize(_fAddOrCla_local->pGia->vCos);
      bVar10 = false;
      if (c < iVar2) {
        pGVar1 = _fAddOrCla_local->pGia;
        pGVar7 = Gia_ManCo(_fAddOrCla_local->pGia,c);
        nVars = Gia_ObjId(pGVar1,pGVar7);
        bVar10 = nVars != 0;
      }
      if (!bVar10) break;
      Vec_IntWriteEntry((Vec_Int_t *)pFanins._56_8_,nVars,nVars);
      c = c + 1;
    }
    nVars = _fAddOrCla_local->pGia->nObjs;
    while (nVars = nVars + -1, 0 < nVars) {
      pGVar7 = Gia_ManObj(_fAddOrCla_local->pGia,nVars);
      iVar2 = Gia_ObjIsAnd(pGVar7);
      if ((iVar2 != 0) && (iVar2 = Mf_ObjMapRefNum(_fAddOrCla_local,nVars), iVar2 != 0)) {
        Vec_IntWriteEntry((Vec_Int_t *)pFanins._56_8_,nVars,nVars);
        iLit = iLit + 1;
      }
    }
    Vec_IntWriteEntry((Vec_Int_t *)pFanins._56_8_,0,0);
    c = 0;
    while( true ) {
      iVar2 = Vec_IntSize(_fAddOrCla_local->pGia->vCis);
      bVar10 = false;
      if (c < iVar2) {
        pGVar1 = _fAddOrCla_local->pGia;
        pGVar7 = Gia_ManCi(_fAddOrCla_local->pGia,c);
        nVars = Gia_ObjId(pGVar1,pGVar7);
        bVar10 = nVars != 0;
      }
      if (!bVar10) break;
      Vec_IntWriteEntry((Vec_Int_t *)pFanins._56_8_,nVars,nVars);
      c = c + 1;
    }
    if (iLit != nLits) {
      __assert_fail("iVar == nVars",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                    ,0x160,"Cnf_Dat_t *Mf_ManDeriveCnf(Mf_Man_t *, int, int)");
    }
  }
  pObj = (Gia_Obj_t *)calloc(1,0x48);
  *(Gia_Man_t **)pObj = _fAddOrCla_local->pGia;
  pObj->Value = nLits;
  *(int *)(pObj + 1) = iCla;
  *(int *)&pObj[1].field_0x4 = iVar;
  pvVar8 = malloc((long)(iVar + 1) << 3);
  *(void **)(pObj + 2) = pvVar8;
  pvVar8 = malloc((long)iCla << 2);
  **(undefined8 **)(pObj + 2) = pvVar8;
  if ((int)pCnf != 0) {
    vCnfs._4_4_ = 1;
    **(undefined8 **)(pObj + 2) = **(undefined8 **)(pObj + 2);
    c = 0;
    while( true ) {
      iVar2 = Vec_IntSize(_fAddOrCla_local->pGia->vCos);
      bVar10 = false;
      if (c < iVar2) {
        pGVar1 = _fAddOrCla_local->pGia;
        pGVar7 = Gia_ManCo(_fAddOrCla_local->pGia,c);
        nVars = Gia_ObjId(pGVar1,pGVar7);
        bVar10 = nVars != 0;
      }
      if (!bVar10) break;
      iVar2 = Abc_Var2Lit(piVar6[nVars],0);
      *(int *)(**(long **)(pObj + 2) + (long)(int)vCnfs * 4) = iVar2;
      c = c + 1;
      vCnfs._0_4_ = (int)vCnfs + 1;
    }
  }
  c = 0;
  while( true ) {
    iVar2 = Vec_IntSize(_fAddOrCla_local->pGia->vCos);
    bVar10 = false;
    if (c < iVar2) {
      _DriId = Gia_ManCo(_fAddOrCla_local->pGia,c);
      bVar10 = _DriId != (Gia_Obj_t *)0x0;
    }
    if (!bVar10) break;
    nVars = Gia_ObjId(_fAddOrCla_local->pGia,_DriId);
    nClas = Gia_ObjFaninId0(_DriId,nVars);
    iVar5 = vCnfs._4_4_ + 1;
    *(long *)(*(long *)(pObj + 2) + (long)vCnfs._4_4_ * 8) =
         **(long **)(pObj + 2) + (long)(int)vCnfs * 4;
    iVar2 = Abc_Var2Lit(piVar6[nVars],0);
    *(int *)(**(long **)(pObj + 2) + (long)(int)vCnfs * 4) = iVar2;
    iVar2 = piVar6[nClas];
    iVar3 = Gia_ObjFaninC0(_DriId);
    iVar2 = Abc_Var2Lit(iVar2,(uint)((iVar3 != 0 ^ 0xffU) & 1));
    *(int *)(**(long **)(pObj + 2) + (long)((int)vCnfs + 1) * 4) = iVar2;
    vCnfs._4_4_ = vCnfs._4_4_ + 2;
    *(long *)(*(long *)(pObj + 2) + (long)iVar5 * 8) =
         **(long **)(pObj + 2) + (long)((int)vCnfs + 2) * 4;
    iVar2 = Abc_Var2Lit(piVar6[nVars],1);
    iVar5 = (int)vCnfs + 3;
    *(int *)(**(long **)(pObj + 2) + (long)((int)vCnfs + 2) * 4) = iVar2;
    iVar2 = piVar6[nClas];
    iVar3 = Gia_ObjFaninC0(_DriId);
    iVar2 = Abc_Var2Lit(iVar2,iVar3);
    vCnfs._0_4_ = (int)vCnfs + 4;
    *(int *)(**(long **)(pObj + 2) + (long)iVar5 * 4) = iVar2;
    c = c + 1;
  }
  nVars = _fAddOrCla_local->pGia->nObjs;
  while (nVars = nVars + -1, 0 < nVars) {
    pGVar7 = Gia_ManObj(_fAddOrCla_local->pGia,nVars);
    iVar2 = Gia_ObjIsAnd(pGVar7);
    if ((iVar2 != 0) && (iVar2 = Mf_ObjMapRefNum(_fAddOrCla_local,nVars), iVar2 != 0)) {
      pCut_00 = Mf_ObjCutBest(_fAddOrCla_local,nVars);
      iVar2 = Mf_CutFunc(pCut_00);
      iVar2 = Abc_Lit2Var(iVar2);
      iVar3 = Mf_CutFunc(pCut_00);
      uVar4 = Abc_LitIsCompl(iVar3);
      for (iFunc = 0; iVar3 = Mf_CutSize(pCut_00), iFunc < iVar3; iFunc = iFunc + 1) {
        pFanins[(long)iFunc + -2] = piVar6[pCut_00[iFunc + 1]];
      }
      pFanins[(long)iFunc + -2] = piVar6[nVars];
      iVar2 = Vec_IntEntry(p_00,iVar2);
      piVar9 = Vec_IntEntryP(p_00,iVar2);
      iVar2 = *piVar9;
      for (nCubes = 0; nCubes < iVar2; nCubes = nCubes + 1) {
        *(long *)(*(long *)(pObj + 2) + (long)vCnfs._4_4_ * 8) =
             **(long **)(pObj + 2) + (long)(int)vCnfs * 4;
        iVar3 = Mf_CutSize(pCut_00);
        iVar5 = Mf_CubeLit(piVar9[(long)nCubes + 1],iVar3);
        if (iVar5 == 0) {
          __assert_fail("Mf_CubeLit(pCubes[c], k)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                        ,0x19e,"Cnf_Dat_t *Mf_ManDeriveCnf(Mf_Man_t *, int, int)");
        }
        iVar5 = pFanins[(long)iVar3 + -2];
        iVar3 = Mf_CubeLit(piVar9[(long)nCubes + 1],iVar3);
        iVar3 = Abc_Var2Lit(iVar5,iVar3 == 2 ^ uVar4);
        *(int *)(**(long **)(pObj + 2) + (long)(int)vCnfs * 4) = iVar3;
        vCnfs._0_4_ = (int)vCnfs + 1;
        for (iFunc = 0; iVar3 = Mf_CutSize(pCut_00), iFunc < iVar3; iFunc = iFunc + 1) {
          iVar3 = Mf_CubeLit(piVar9[(long)nCubes + 1],iFunc);
          if (iVar3 != 0) {
            iVar3 = pFanins[(long)iFunc + -2];
            iVar5 = Mf_CubeLit(piVar9[(long)nCubes + 1],iFunc);
            iVar3 = Abc_Var2Lit(iVar3,(uint)(iVar5 == 2));
            *(int *)(**(long **)(pObj + 2) + (long)(int)vCnfs * 4) = iVar3;
            vCnfs._0_4_ = (int)vCnfs + 1;
          }
        }
        vCnfs._4_4_ = vCnfs._4_4_ + 1;
      }
    }
  }
  *(long *)(*(long *)(pObj + 2) + (long)vCnfs._4_4_ * 8) =
       **(long **)(pObj + 2) + (long)(int)vCnfs * 4;
  iVar2 = Abc_Var2Lit(*piVar6,1);
  *(int *)(**(long **)(pObj + 2) + (long)(int)vCnfs * 4) = iVar2;
  if (vCnfs._4_4_ + 1 != iVar) {
    __assert_fail("iCla == nClas",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                  ,0x1a8,"Cnf_Dat_t *Mf_ManDeriveCnf(Mf_Man_t *, int, int)");
  }
  if ((int)vCnfs + 1 != iCla) {
    __assert_fail("iLit == nLits",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                  ,0x1a9,"Cnf_Dat_t *Mf_ManDeriveCnf(Mf_Man_t *, int, int)");
  }
  *(long *)(*(long *)(pObj + 2) + (long)(vCnfs._4_4_ + 1) * 8) =
       **(long **)(pObj + 2) + (long)((int)vCnfs + 1) * 4;
  Vec_IntFree(p_00);
  if (pCnf._4_4_ == 0) {
    if (_fAddOrCla_local->pGia == _fAddOrCla_local->pGia0) {
      piVar6 = Vec_IntReleaseArray((Vec_Int_t *)pFanins._56_8_);
      *(int **)&pObj[2].Value = piVar6;
    }
    else {
      iVar2 = Gia_ManObjNum(_fAddOrCla_local->pGia0);
      pvVar8 = malloc((long)iVar2 << 2);
      iVar2 = Gia_ManObjNum(_fAddOrCla_local->pGia0);
      memset(pvVar8,0xff,(long)iVar2 << 2);
      *(void **)&pObj[2].Value = pvVar8;
      c = 0;
      while( true ) {
        iVar2 = Vec_IntSize(_fAddOrCla_local->pGia0->vCis);
        bVar10 = false;
        if (c < iVar2) {
          pGVar1 = _fAddOrCla_local->pGia0;
          pGVar7 = Gia_ManCi(_fAddOrCla_local->pGia0,c);
          nVars = Gia_ObjId(pGVar1,pGVar7);
          bVar10 = nVars != 0;
        }
        if (!bVar10) break;
        iVar2 = Gia_ManCiIdToId(_fAddOrCla_local->pGia,c);
        *(int *)(*(long *)&pObj[2].Value + (long)nVars * 4) = piVar6[iVar2];
        c = c + 1;
      }
      c = 0;
      while( true ) {
        iVar2 = Vec_IntSize(_fAddOrCla_local->pGia0->vCos);
        bVar10 = false;
        if (c < iVar2) {
          pGVar1 = _fAddOrCla_local->pGia0;
          pGVar7 = Gia_ManCo(_fAddOrCla_local->pGia0,c);
          nVars = Gia_ObjId(pGVar1,pGVar7);
          bVar10 = nVars != 0;
        }
        if (!bVar10) break;
        iVar2 = Gia_ManCoIdToId(_fAddOrCla_local->pGia,c);
        *(int *)(*(long *)&pObj[2].Value + (long)nVars * 4) = piVar6[iVar2];
        c = c + 1;
      }
    }
  }
  else {
    iVar2 = Gia_ManObjNum(_fAddOrCla_local->pGia);
    pvVar8 = malloc((long)iVar2 << 2);
    iVar2 = Gia_ManObjNum(_fAddOrCla_local->pGia);
    memset(pvVar8,0xff,(long)iVar2 << 2);
    *(void **)&pObj[3].field_0x4 = pvVar8;
    iVar2 = Gia_ManObjNum(_fAddOrCla_local->pGia);
    pvVar8 = malloc((long)iVar2 << 2);
    iVar2 = Gia_ManObjNum(_fAddOrCla_local->pGia);
    memset(pvVar8,0xff,(long)iVar2 << 2);
    *(void **)(pObj + 4) = pvVar8;
    for (c = 0; c < *(int *)&pObj[1].field_0x4; c = c + 1) {
      nVars = Abc_Lit2Var(**(int **)(*(long *)(pObj + 2) + (long)c * 8));
      if (*(int *)(*(long *)&pObj[3].field_0x4 + (long)nVars * 4) == -1) {
        *(int *)(*(long *)&pObj[3].field_0x4 + (long)nVars * 4) = c;
        *(undefined4 *)(*(long *)(pObj + 4) + (long)nVars * 4) = 1;
      }
      else {
        if (*(int *)(*(long *)(pObj + 4) + (long)nVars * 4) < 1) {
          __assert_fail("pCnf->pObj2Count[Id] > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                        ,0x1bd,"Cnf_Dat_t *Mf_ManDeriveCnf(Mf_Man_t *, int, int)");
        }
        *(int *)(*(long *)(pObj + 4) + (long)nVars * 4) =
             *(int *)(*(long *)(pObj + 4) + (long)nVars * 4) + 1;
      }
    }
  }
  Vec_IntFree((Vec_Int_t *)pFanins._56_8_);
  return (Cnf_Dat_t *)pObj;
}

Assistant:

Cnf_Dat_t * Mf_ManDeriveCnf( Mf_Man_t * p, int fCnfObjIds, int fAddOrCla )
{
    Cnf_Dat_t * pCnf; 
    Gia_Obj_t * pObj;
    int Id, DriId, nVars, nClas, nLits, iVar = 1, iCla = 0, iLit = 0;
    Vec_Int_t * vCnfs = Mf_ManDeriveCnfs( p, &nVars, &nClas, &nLits );
    Vec_Int_t * vCnfIds = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    int pFanins[16], * pCut, * pCnfIds = Vec_IntArray( vCnfIds );
    int i, k, c, iFunc, nCubes, * pCubes, fComplLast;
    nVars++;  // zero-ID to remain unused
    if ( fAddOrCla )
    {
        nClas++;
        nLits += Gia_ManCoNum(p->pGia);
    }
    // create CNF IDs
    if ( fCnfObjIds )
    {
        iVar += 1 + Gia_ManCiNum(p->pGia) + Gia_ManCoNum(p->pGia);
        Gia_ManForEachCoId( p->pGia, Id, i )
            Vec_IntWriteEntry( vCnfIds, Id, Id );
        Gia_ManForEachAndReverseId( p->pGia, Id )
            if ( Mf_ObjMapRefNum(p, Id) )
                Vec_IntWriteEntry( vCnfIds, Id, Id ), iVar++;
        Vec_IntWriteEntry( vCnfIds, 0, 0 );
        Gia_ManForEachCiId( p->pGia, Id, i )
            Vec_IntWriteEntry( vCnfIds, Id, Id );
        assert( iVar == nVars );
    }
    else
    {
        Gia_ManForEachCoId( p->pGia, Id, i )
            Vec_IntWriteEntry( vCnfIds, Id, iVar++ );
        Gia_ManForEachAndReverseId( p->pGia, Id )
            if ( Mf_ObjMapRefNum(p, Id) )
                Vec_IntWriteEntry( vCnfIds, Id, iVar++ );
        Vec_IntWriteEntry( vCnfIds, 0, iVar++ );
        Gia_ManForEachCiId( p->pGia, Id, i )
            Vec_IntWriteEntry( vCnfIds, Id, iVar++ );
        assert( iVar == nVars );
    }
    // generate CNF
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->pMan        = (Aig_Man_t *)p->pGia;
    pCnf->nVars       = nVars;
    pCnf->nLiterals   = nLits;
    pCnf->nClauses    = nClas;
    pCnf->pClauses    = ABC_ALLOC( int *, nClas+1 );
    pCnf->pClauses[0] = ABC_ALLOC( int, nLits );
    // add last clause
    if ( fAddOrCla )
    {
        pCnf->pClauses[iCla++] = pCnf->pClauses[0] + iLit;
        Gia_ManForEachCoId( p->pGia, Id, i )
            pCnf->pClauses[0][iLit++] = Abc_Var2Lit(pCnfIds[Id], 0);
    }
    // add clauses for the COs
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        Id = Gia_ObjId( p->pGia, pObj );
        DriId = Gia_ObjFaninId0( pObj, Id );

        pCnf->pClauses[iCla++] = pCnf->pClauses[0] + iLit;
        pCnf->pClauses[0][iLit++] = Abc_Var2Lit(pCnfIds[Id], 0);
        pCnf->pClauses[0][iLit++] = Abc_Var2Lit(pCnfIds[DriId], !Gia_ObjFaninC0(pObj));

        pCnf->pClauses[iCla++] = pCnf->pClauses[0] + iLit;
        pCnf->pClauses[0][iLit++] = Abc_Var2Lit(pCnfIds[Id], 1);
        pCnf->pClauses[0][iLit++] = Abc_Var2Lit(pCnfIds[DriId], Gia_ObjFaninC0(pObj));
    }
    // add clauses for the mapping
    Gia_ManForEachAndReverseId( p->pGia, Id )
    {
        if ( !Mf_ObjMapRefNum(p, Id) )
            continue;
        pCut = Mf_ObjCutBest( p, Id );
        iFunc = Abc_Lit2Var( Mf_CutFunc(pCut) );
        //Dau_DsdPrintFromTruth( Vec_MemReadEntry(p->vTtMem, iFunc), 3 );
        fComplLast = Abc_LitIsCompl( Mf_CutFunc(pCut) );
        for ( k = 0; k < Mf_CutSize(pCut); k++ )
            pFanins[k] = pCnfIds[pCut[k+1]];
        pFanins[k++] = pCnfIds[Id];
        // get clauses
        pCubes = Vec_IntEntryP( vCnfs, Vec_IntEntry(vCnfs, iFunc) );
        nCubes = *pCubes++;
        for ( c = 0; c < nCubes; c++ )
        {
            pCnf->pClauses[iCla++] = pCnf->pClauses[0] + iLit;
            k = Mf_CutSize(pCut);
            assert( Mf_CubeLit(pCubes[c], k) );
            pCnf->pClauses[0][iLit++] = Abc_Var2Lit( pFanins[k], (Mf_CubeLit(pCubes[c], k) == 2) ^ fComplLast );
            for ( k = 0; k < Mf_CutSize(pCut); k++ )
                if ( Mf_CubeLit(pCubes[c], k) )
                    pCnf->pClauses[0][iLit++] = Abc_Var2Lit( pFanins[k], Mf_CubeLit(pCubes[c], k) == 2 );
        }
    }
    // constant clause
    pCnf->pClauses[iCla++] = pCnf->pClauses[0] + iLit;
    pCnf->pClauses[0][iLit++] = Abc_Var2Lit(pCnfIds[0], 1);
    assert( iCla == nClas );
    assert( iLit == nLits );
    // add closing pointer
    pCnf->pClauses[iCla++] = pCnf->pClauses[0] + iLit;
    // cleanup
    Vec_IntFree( vCnfs );
    // create mapping of objects into their clauses
    if ( fCnfObjIds )
    {
        pCnf->pObj2Clause = ABC_FALLOC( int, Gia_ManObjNum(p->pGia) );
        pCnf->pObj2Count  = ABC_FALLOC( int, Gia_ManObjNum(p->pGia) );
        for ( i = 0; i < pCnf->nClauses; i++ )
        {
            Id = Abc_Lit2Var(pCnf->pClauses[i][0]);
            if ( pCnf->pObj2Clause[Id] == -1 )
            {
                pCnf->pObj2Clause[Id] = i;
                pCnf->pObj2Count[Id] = 1;
            }
            else
            {
                assert( pCnf->pObj2Count[Id] > 0 );
                pCnf->pObj2Count[Id]++;
            }
        }
    }
    else
    {
        if ( p->pGia != p->pGia0 ) // diff managers - create map for CIs/COs
        {
            pCnf->pVarNums = ABC_FALLOC( int, Gia_ManObjNum(p->pGia0) );
            Gia_ManForEachCiId( p->pGia0, Id, i )
                pCnf->pVarNums[Id] = pCnfIds[Gia_ManCiIdToId(p->pGia, i)];
            Gia_ManForEachCoId( p->pGia0, Id, i )
                pCnf->pVarNums[Id] = pCnfIds[Gia_ManCoIdToId(p->pGia, i)];
/*
            // transform polarity of the internal nodes
            Gia_ManSetPhase( p->pGia );
            Gia_ManForEachCo( p->pGia, pObj, i )
                pObj->fPhase = 0;
            for ( i = 0; i < pCnf->nLiterals; i++ )
                if ( Gia_ManObj(p->pGia, Abc_Lit2Var(pCnf->pClauses[0][i]))->fPhase )
                    pCnf->pClauses[0][i] = Abc_LitNot( pCnf->pClauses[0][i] );
*/
        }
        else
            pCnf->pVarNums = Vec_IntReleaseArray(vCnfIds);
    }
    Vec_IntFree( vCnfIds );
    return pCnf;
}